

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_getlocal(lua_State *L)

{
  TValue *pTVar1;
  int32_t n;
  int32_t level;
  int iVar2;
  char *pcVar3;
  lua_State *L_00;
  uint uVar4;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  pTVar1 = L->base;
  uVar4 = 0;
  L_00 = L;
  if ((pTVar1 < L->top) && (uVar4 = 0, (pTVar1->field_2).it == 0xfffffff9)) {
    uVar4 = 1;
    L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  n = lj_lib_checkint(L,uVar4 + 2);
  if (*(int *)((long)L->base + (ulong)uVar4 * 8 + 4) == -9) {
    L->top = L->base + (ulong)uVar4 + 1;
    pcVar3 = lua_getlocal(L,(lua_Debug *)0x0,n);
    lua_pushstring(L,pcVar3);
  }
  else {
    level = lj_lib_checkint(L,uVar4 + 1);
    iVar2 = lua_getstack(L_00,level,&lStack_98);
    if (iVar2 == 0) {
      lj_err_arg(L,uVar4 + 1,LJ_ERR_LVLRNG);
    }
    pcVar3 = lua_getlocal(L_00,&lStack_98,n);
    if (pcVar3 != (char *)0x0) {
      lua_xmove(L_00,L,1);
      lua_pushstring(L,pcVar3);
      lua_pushvalue(L,-2);
      return 2;
    }
    *(undefined4 *)((long)L->top + -4) = 0xffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}